

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O2

int cvLsLinSys(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix A,int jok,int *jcur,sunrealtype gamma,
              void *cvode_mem,N_Vector vtemp1,N_Vector vtemp2,N_Vector vtemp3)

{
  int iVar1;
  int iVar2;
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  sunrealtype local_40;
  sunrealtype local_38;
  
  local_40 = t;
  local_38 = gamma;
  iVar1 = cvLs_AccessLMem(cvode_mem,"cvLsLinSys",&cv_mem,&cvls_mem);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (jok == 0) {
    *jcur = 1;
    iVar1 = SUNLinSolGetType(cvls_mem->LS);
    if ((iVar1 == 0) && (iVar1 = SUNMatZero(A), iVar1 != 0)) {
      iVar1 = 0x544;
    }
    else {
      iVar1 = (*cvls_mem->jac)(local_40,y,fy,A,cvls_mem->J_data,vtemp1,vtemp2,vtemp3);
      if (iVar1 < 0) {
        iVar2 = -6;
        cvProcessError(cv_mem,-6,0x54f,"cvLsLinSys",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_ls.c"
                       ,"The Jacobian routine failed in an unrecoverable manner.");
        iVar1 = -1;
        goto LAB_00114d8a;
      }
      if (iVar1 != 0) {
        iVar1 = 1;
        iVar2 = -7;
        goto LAB_00114d8a;
      }
      iVar1 = SUNMatCopy(A,cvls_mem->savedJ);
      if (iVar1 == 0) goto LAB_00114d45;
      iVar1 = 0x55e;
    }
  }
  else {
    *jcur = 0;
    iVar1 = SUNMatCopy(cvls_mem->savedJ,A);
    if (iVar1 == 0) {
LAB_00114d45:
      iVar1 = SUNMatScaleAddI(-local_38,A);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = 0x569;
    }
    else {
      iVar1 = 0x533;
    }
  }
  iVar2 = -8;
  cvProcessError(cv_mem,-8,iVar1,"cvLsLinSys",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_ls.c"
                 ,"A SUNMatrix routine failed in an unrecoverable manner.");
  iVar1 = iVar2;
LAB_00114d8a:
  cvls_mem->last_flag = iVar2;
  return iVar1;
}

Assistant:

static int cvLsLinSys(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix A,
                      sunbooleantype jok, sunbooleantype* jcur,
                      sunrealtype gamma, void* cvode_mem, N_Vector vtemp1,
                      N_Vector vtemp2, N_Vector vtemp3)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Check if Jacobian needs to be updated */
  if (jok)
  {
    /* Use saved copy of J */
    *jcur = SUNFALSE;

    /* Overwrite linear system matrix with saved J */
    retval = SUNMatCopy(cvls_mem->savedJ, A);
    if (retval)
    {
      cvProcessError(cv_mem, CVLS_SUNMAT_FAIL, __LINE__, __func__, __FILE__,
                     MSG_LS_SUNMAT_FAILED);
      cvls_mem->last_flag = CVLS_SUNMAT_FAIL;
      return (cvls_mem->last_flag);
    }
  }
  else
  {
    /* Call jac() routine to update J */
    *jcur = SUNTRUE;

    /* Clear the linear system matrix if necessary */
    if (SUNLinSolGetType(cvls_mem->LS) == SUNLINEARSOLVER_DIRECT)
    {
      retval = SUNMatZero(A);
      if (retval)
      {
        cvProcessError(cv_mem, CVLS_SUNMAT_FAIL, __LINE__, __func__, __FILE__,
                       MSG_LS_SUNMAT_FAILED);
        cvls_mem->last_flag = CVLS_SUNMAT_FAIL;
        return (cvls_mem->last_flag);
      }
    }

    /* Compute new Jacobian matrix */
    retval = cvls_mem->jac(t, y, fy, A, cvls_mem->J_data, vtemp1, vtemp2, vtemp3);
    if (retval < 0)
    {
      cvProcessError(cv_mem, CVLS_JACFUNC_UNRECVR, __LINE__, __func__, __FILE__,
                     MSG_LS_JACFUNC_FAILED);
      cvls_mem->last_flag = CVLS_JACFUNC_UNRECVR;
      return (-1);
    }
    if (retval > 0)
    {
      cvls_mem->last_flag = CVLS_JACFUNC_RECVR;
      return (1);
    }

    /* Update saved copy of the Jacobian matrix */
    retval = SUNMatCopy(A, cvls_mem->savedJ);
    if (retval)
    {
      cvProcessError(cv_mem, CVLS_SUNMAT_FAIL, __LINE__, __func__, __FILE__,
                     MSG_LS_SUNMAT_FAILED);
      cvls_mem->last_flag = CVLS_SUNMAT_FAIL;
      return (cvls_mem->last_flag);
    }
  }

  /* Perform linear combination A = I - gamma*J */
  retval = SUNMatScaleAddI(-gamma, A);
  if (retval)
  {
    cvProcessError(cv_mem, CVLS_SUNMAT_FAIL, __LINE__, __func__, __FILE__,
                   MSG_LS_SUNMAT_FAILED);
    cvls_mem->last_flag = CVLS_SUNMAT_FAIL;
    return (cvls_mem->last_flag);
  }

  return (CVLS_SUCCESS);
}